

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<std::tuple<unsigned_long,_unsigned_long>_> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ParamGenerator<std::tuple<unsigned_long,_unsigned_long>_> PVar2;
  __normal_iterator<const_std::tuple<unsigned_long,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>
  local_28;
  __normal_iterator<const_std::tuple<unsigned_long,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>
  local_20;
  long local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  ValueArray<std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsi...long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>,std::tuple<unsigned_long,unsigned_long>>
  ::
  MakeVector<std::tuple<unsigned_long,unsigned_long>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul,30ul,31ul,32ul,33ul,34ul,35ul,36ul,37ul,38ul,39ul,40ul,41ul,42ul,43ul,44ul,45ul,46ul,47ul,48ul,49ul>
            (&local_28);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long>const*,std::vector<std::tuple<unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long>>>>>
                    ((testing *)this,local_28,local_20);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_long,_unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_28._M_current != (tuple<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_28._M_current,local_18 - (long)local_28._M_current);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_long,_unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_long,_unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<unsigned_long,_unsigned_long>_>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_long,_unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(std::make_index_sequence<sizeof...(Ts)>()));
  }